

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall spirv_cross::ParsedIR::fixup_reserved_names(ParsedIR *this)

{
  bool bVar1;
  reference puVar2;
  Vector<Decoration> *this_00;
  Decoration *pDVar3;
  Decoration *memb;
  Decoration *__end2;
  Decoration *__begin2;
  Vector<Decoration> *__range2;
  mapped_type *local_38;
  mapped_type *m;
  _Node_iterator_base<unsigned_int,_false> _Stack_28;
  uint32_t id;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  ParsedIR *this_local;
  
  __end1 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(&this->meta_needing_name_fixup);
  _Stack_28._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(&this->meta_needing_name_fixup);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffffd8);
    if (!bVar1) break;
    puVar2 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end1);
    m._4_4_ = *puVar2;
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)((long)&__range2 + 4),m._4_4_);
    local_38 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&this->meta,(key_type *)((long)&__range2 + 4));
    sanitize_identifier((string *)local_38,false,false);
    this_00 = &local_38->members;
    __end2 = VectorView<spirv_cross::Meta::Decoration>::begin
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
    pDVar3 = VectorView<spirv_cross::Meta::Decoration>::end
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
    for (; __end2 != pDVar3; __end2 = __end2 + 1) {
      sanitize_identifier(&__end2->alias,true,false);
    }
    ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end1);
  }
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->meta_needing_name_fixup);
  return;
}

Assistant:

void ParsedIR::fixup_reserved_names()
{
	for (uint32_t id : meta_needing_name_fixup)
	{
		auto &m = meta[id];
		sanitize_identifier(m.decoration.alias, false, false);
		for (auto &memb : m.members)
			sanitize_identifier(memb.alias, true, false);
	}
	meta_needing_name_fixup.clear();
}